

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.c
# Opt level: O2

sysbvm_tuple_t
sysbvm_astIfNode_primitiveAnalyze
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  sysbvm_tuple_t supertype;
  sysbvm_tuple_t sVar1;
  sysbvm_astIfNode_t *psVar2;
  _Bool _Var3;
  _Bool _Var4;
  sysbvm_tuple_t sVar5;
  sysbvm_tuple_t type;
  anon_struct_56_7_8f908ccc gcFrame;
  sysbvm_stackFrameSourcePositionRecord_t sourcePositionRecord;
  sysbvm_stackFrameRecord_t local_58;
  undefined8 local_48;
  anon_struct_56_7_8f908ccc *local_40;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  local_40 = &gcFrame;
  gcFrame.analyzedFalseExpression = 0;
  gcFrame.analyzedFalseExpressionType = 0;
  gcFrame.analyzedTrueExpression = 0;
  gcFrame.analyzedTrueExpressionType = 0;
  gcFrame.ifNode = (sysbvm_astIfNode_t *)0x0;
  gcFrame.analyzedCondition = 0;
  gcFrame.analyzedTakenBranch = 0;
  local_58.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_58.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_58._12_4_ = 0;
  local_48 = 7;
  sysbvm_stackFrame_pushRecord(&local_58);
  gcFrame.ifNode = (sysbvm_astIfNode_t *)sysbvm_context_shallowCopy(context,*arguments);
  sVar5 = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context,arguments[1]);
  ((gcFrame.ifNode)->super).analyzerToken = sVar5;
  sourcePositionRecord.previous = (sysbvm_stackFrameRecord_t *)0x0;
  sourcePositionRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_SOURCE_POSITION;
  sourcePositionRecord.sourcePosition = ((gcFrame.ifNode)->super).sourcePosition;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
  gcFrame.analyzedCondition =
       sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment
                 (context,(gcFrame.ifNode)->conditionExpression,(context->roots).booleanType,
                  arguments[1]);
  (gcFrame.ifNode)->conditionExpression = gcFrame.analyzedCondition;
  if ((gcFrame.ifNode)->trueExpression != 0) {
    gcFrame.analyzedTrueExpression =
         sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment
                   (context,(gcFrame.ifNode)->trueExpression,arguments[1]);
    (gcFrame.ifNode)->trueExpression = gcFrame.analyzedTrueExpression;
  }
  if ((gcFrame.ifNode)->falseExpression != 0) {
    gcFrame.analyzedFalseExpression =
         sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment
                   (context,(gcFrame.ifNode)->falseExpression,arguments[1]);
    (gcFrame.ifNode)->falseExpression = gcFrame.analyzedFalseExpression;
  }
  _Var3 = sysbvm_astNode_isLiteralNode(context,(gcFrame.ifNode)->conditionExpression);
  psVar2 = gcFrame.ifNode;
  if (_Var3) {
    sVar5 = sysbvm_astLiteralNode_getValue((gcFrame.ifNode)->conditionExpression);
    gcFrame.analyzedTakenBranch = (&(gcFrame.ifNode)->trueExpression)[sVar5 != 0x1f];
    if (gcFrame.analyzedTakenBranch == 0) {
      gcFrame.analyzedTakenBranch =
           sysbvm_astLiteralNode_create(context,((gcFrame.ifNode)->super).sourcePosition,0x2f);
    }
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
    sysbvm_stackFrame_popRecord(&local_58);
  }
  else {
    ((gcFrame.ifNode)->super).analyzedType = (context->roots).anyValueType;
    if (gcFrame.analyzedFalseExpression == 0 || gcFrame.analyzedTrueExpression == 0) {
      if (((gcFrame.ifNode)->trueExpression == 0) || ((gcFrame.ifNode)->falseExpression == 0)) {
        ((gcFrame.ifNode)->super).analyzedType = (context->roots).voidType;
      }
    }
    else {
      if ((gcFrame.analyzedTrueExpression & 0xf) == 0) {
        sVar5 = *(sysbvm_tuple_t *)(gcFrame.analyzedTrueExpression + 0x20);
      }
      else {
        sVar5 = 0;
      }
      if ((gcFrame.analyzedFalseExpression & 0xf) == 0) {
        type = *(sysbvm_tuple_t *)(gcFrame.analyzedFalseExpression + 0x20);
      }
      else {
        type = 0;
      }
      supertype = (context->roots).controlFlowEscapeType;
      gcFrame.analyzedTrueExpressionType = sVar5;
      gcFrame.analyzedFalseExpressionType = type;
      _Var3 = sysbvm_type_isDirectSubtypeOf(sVar5,supertype);
      sVar1 = (context->roots).undefinedObjectType;
      _Var4 = sysbvm_type_isDirectSubtypeOf(type,supertype);
      if (sVar5 == sVar1 || _Var3) {
        (psVar2->super).analyzedType = type;
      }
      else if (_Var4 || type == sVar1) {
        (psVar2->super).analyzedType = sVar5;
      }
      else {
        sVar5 = sysbvm_type_computeLCA(sVar5,type);
        ((gcFrame.ifNode)->super).analyzedType = sVar5;
        if (sVar5 == 0) {
          ((gcFrame.ifNode)->super).analyzedType = (context->roots).anyValueType;
        }
      }
    }
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&sourcePositionRecord);
    sysbvm_stackFrame_popRecord(&local_58);
    gcFrame.analyzedTakenBranch = (sysbvm_tuple_t)gcFrame.ifNode;
  }
  return gcFrame.analyzedTakenBranch;
}

Assistant:

static sysbvm_tuple_t sysbvm_astIfNode_primitiveAnalyze(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_tuple_t *environment = &arguments[1];

    struct {
        sysbvm_astIfNode_t *ifNode;
        sysbvm_tuple_t analyzedCondition;
        sysbvm_tuple_t analyzedTrueExpression;
        sysbvm_tuple_t analyzedTrueExpressionType;
        sysbvm_tuple_t analyzedFalseExpression;
        sysbvm_tuple_t analyzedFalseExpressionType;

        sysbvm_tuple_t analyzedTakenBranch;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    gcFrame.ifNode = (sysbvm_astIfNode_t*)sysbvm_context_shallowCopy(context, *node);
    gcFrame.ifNode->super.analyzerToken = sysbvm_analysisAndEvaluationEnvironment_ensureValidAnalyzerToken(context, *environment);
    SYSBVM_STACKFRAME_PUSH_SOURCE_POSITION(sourcePositionRecord, gcFrame.ifNode->super.sourcePosition);

    gcFrame.analyzedCondition = sysbvm_interpreter_analyzeASTWithExpectedTypeWithEnvironment(context, gcFrame.ifNode->conditionExpression, context->roots.booleanType, *environment);
    gcFrame.ifNode->conditionExpression = gcFrame.analyzedCondition;
    if(gcFrame.ifNode->trueExpression)
    {
        gcFrame.analyzedTrueExpression = sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment(context, gcFrame.ifNode->trueExpression, *environment);
        gcFrame.ifNode->trueExpression = gcFrame.analyzedTrueExpression;
    }
    if(gcFrame.ifNode->falseExpression)
    {
        gcFrame.analyzedFalseExpression = sysbvm_interpreter_analyzeASTWithCurrentExpectedTypeWithEnvironment(context, gcFrame.ifNode->falseExpression, *environment);
        gcFrame.ifNode->falseExpression = gcFrame.analyzedFalseExpression;
    }

    if(sysbvm_astNode_isLiteralNode(context, gcFrame.ifNode->conditionExpression))
    {
        bool conditionValue = sysbvm_tuple_boolean_decode(sysbvm_astLiteralNode_getValue(gcFrame.ifNode->conditionExpression));
        gcFrame.analyzedTakenBranch = conditionValue ? gcFrame.ifNode->trueExpression : gcFrame.ifNode->falseExpression;
        if(!gcFrame.analyzedTakenBranch)
            gcFrame.analyzedTakenBranch = sysbvm_astLiteralNode_create(context, gcFrame.ifNode->super.sourcePosition, SYSBVM_VOID_TUPLE);
        
        SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return gcFrame.analyzedTakenBranch;
    }

    // Require the same, otherwise fallback to void.
    gcFrame.ifNode->super.analyzedType = context->roots.anyValueType;
    if(gcFrame.analyzedTrueExpression && gcFrame.analyzedFalseExpression)
    {
        gcFrame.analyzedTrueExpressionType = sysbvm_astNode_getAnalyzedType(gcFrame.analyzedTrueExpression);
        gcFrame.analyzedFalseExpressionType = sysbvm_astNode_getAnalyzedType(gcFrame.analyzedFalseExpression);
        bool trueExpressionIsControlFlowEscape = sysbvm_type_isDirectSubtypeOf(gcFrame.analyzedTrueExpressionType, context->roots.controlFlowEscapeType);
        bool trueExpressionIsUndefinedType = gcFrame.analyzedTrueExpressionType == context->roots.undefinedObjectType;

        bool falseExpressionIsControlFlowEscape = sysbvm_type_isDirectSubtypeOf(gcFrame.analyzedFalseExpressionType, context->roots.controlFlowEscapeType);
        bool falseExpressionIsUndefinedType = gcFrame.analyzedFalseExpressionType == context->roots.undefinedObjectType;

        if(trueExpressionIsControlFlowEscape || trueExpressionIsUndefinedType)
        {
            gcFrame.ifNode->super.analyzedType = gcFrame.analyzedFalseExpressionType;
        }
        else if(falseExpressionIsControlFlowEscape || falseExpressionIsUndefinedType)
        {
            gcFrame.ifNode->super.analyzedType = gcFrame.analyzedTrueExpressionType;
        }
        else
        {
            gcFrame.ifNode->super.analyzedType = sysbvm_type_computeLCA(gcFrame.analyzedTrueExpressionType, gcFrame.analyzedFalseExpressionType);
            if(!gcFrame.ifNode->super.analyzedType)
                gcFrame.ifNode->super.analyzedType = context->roots.anyValueType;
        }
    }
    else if(!gcFrame.ifNode->trueExpression || !gcFrame.ifNode->falseExpression)
    {
        gcFrame.ifNode->super.analyzedType = context->roots.voidType;
    }

    SYSBVM_STACKFRAME_POP_SOURCE_POSITION(sourcePositionRecord);
    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return (sysbvm_tuple_t)gcFrame.ifNode;
}